

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTables(FileGenerator *this,Printer *printer)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  LogMessage *pLVar4;
  int i_4;
  size_t offset;
  long lVar5;
  size_t aux_offset;
  int i;
  ulong uVar6;
  LogFinisher local_dd;
  int idx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  Formatter format;
  size_t value_1;
  pointer local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  if ((this->options_).table_driven_parsing == true) {
    Formatter::operator()<>
              (&format,
               "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n    const $tablename$::entries[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 0;
    for (uVar6 = 0;
        puVar1 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->message_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar6 = uVar6 + 1) {
      aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)MessageGenerator::GenerateParseOffsets
                              ((MessageGenerator *)
                               puVar1[uVar6]._M_t.
                               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                               ._M_t,printer);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&entries,(value_type_conflict3 *)&aux_entries);
      lVar5 = lVar5 + (long)aux_entries.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar5 == 0) {
      Formatter::operator()<>(&format,"{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\n\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::AuxiliaryParseTableField\n    const $tablename$::aux[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 0;
    for (uVar6 = 0;
        puVar1 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->message_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar6 = uVar6 + 1) {
      value_1 = MessageGenerator::GenerateParseAuxTable
                          ((MessageGenerator *)
                           puVar1[uVar6]._M_t.
                           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                           ._M_t,printer);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&aux_entries,&value_1);
      lVar5 = lVar5 + value_1;
    }
    if (lVar5 == 0) {
      Formatter::operator()<>(&format,"::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\nPROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n    $tablename$::schema[] PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n"
              );
    io::Printer::Indent(format.printer_);
    uVar6 = 0;
    offset = 0;
    aux_offset = 0;
    while( true ) {
      puVar1 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= uVar6) break;
      MessageGenerator::GenerateParseTable
                (puVar1[uVar6]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>.
                 _M_head_impl,printer,offset,aux_offset);
      offset = offset + entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6];
      aux_offset = aux_offset +
                   aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    }
    if (puVar1 == puVar2) {
      Formatter::operator()<>(&format,"{ nullptr, nullptr, 0, -1, -1, false },\n");
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"};\n\n");
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  if (((this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->message_generators_).
       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->options_).table_driven_serialization == true)) {
    Formatter::operator()<>
              (&format,
               "const ::$proto_ns$::internal::FieldMetadata $tablename$::field_metadata[] = {\n");
    io::Printer::Indent(format.printer_);
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    idx = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(this->message_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->message_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&aux_entries,&idx);
      iVar3 = MessageGenerator::GenerateFieldMetadata
                        ((MessageGenerator *)
                         (this->message_generators_).
                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t,printer);
      idx = idx + iVar3;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&aux_entries,&idx);
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>
              (&format,
               "};\nconst ::$proto_ns$::internal::SerializationTable $tablename$::serialization_table[] = {\n"
              );
    io::Printer::Indent(format.printer_);
    FlattenMessagesInFile
              ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)&value_1,this->file_);
    if ((long)local_78 - value_1 !=
        (long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&entries,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                 ,999);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)&entries,
                          "CHECK failed: (calculated_order.size()) == (message_generators_.size()): "
                         );
      internal::LogFinisher::operator=(&local_dd,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)&entries);
    }
    lVar5 = 0;
    for (uVar6 = 0;
        puVar1 = (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->message_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar6 = uVar6 + 1) {
      if (*(long *)(value_1 + uVar6 * 8) !=
          *(long *)puVar1[uVar6]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                   ._M_t) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&entries,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
                   ,0x3e9);
        pLVar4 = internal::LogMessage::operator<<
                           ((LogMessage *)&entries,
                            "CHECK failed: (calculated_order[i]) == (message_generators_[i]->descriptor_): "
                           );
        internal::LogFinisher::operator=(&local_dd,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)&entries);
      }
      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(entries.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             *(int *)((long)aux_entries.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar5 + 4) -
                             *(int *)((long)aux_entries.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar5));
      Formatter::operator()
                (&format,"{$1$, $tablename$::field_metadata + $2$},\n",(int *)&entries,
                 (int *)((long)aux_entries.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + 4;
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"};\n\n");
    std::
    _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)&value_1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&aux_entries);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateTables(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (options_.table_driven_parsing) {
    // TODO(ckennelly): Gate this with the same options flag to enable
    // table-driven parsing.
    format(
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTableField\n"
        "    const $tablename$::entries[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> entries;
    size_t count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseOffsets(printer);
      entries.push_back(value);
      count += value;
    }

    // We need these arrays to exist, and MSVC does not like empty arrays.
    if (count == 0) {
      format("{0, 0, 0, ::$proto_ns$::internal::kInvalidMask, 0, 0},\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n"
        "PROTOBUF_CONSTEXPR_VAR "
        "::$proto_ns$::internal::AuxiliaryParseTableField\n"
        "    const $tablename$::aux[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    std::vector<size_t> aux_entries;
    count = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
      aux_entries.push_back(value);
      count += value;
    }

    if (count == 0) {
      format("::$proto_ns$::internal::AuxiliaryParseTableField(),\n");
    }

    format.Outdent();
    format(
        "};\n"
        "PROTOBUF_CONSTEXPR_VAR ::$proto_ns$::internal::ParseTable const\n"
        "    $tablename$::schema[] "
        "PROTOBUF_SECTION_VARIABLE(protodesc_cold) = {\n");
    format.Indent();

    size_t offset = 0;
    size_t aux_offset = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
      offset += entries[i];
      aux_offset += aux_entries[i];
    }

    if (message_generators_.empty()) {
      format("{ nullptr, nullptr, 0, -1, -1, false },\n");
    }

    format.Outdent();
    format(
        "};\n"
        "\n");
  }

  if (!message_generators_.empty() && options_.table_driven_serialization) {
    format(
        "const ::$proto_ns$::internal::FieldMetadata "
        "$tablename$::field_metadata[] "
        "= {\n");
    format.Indent();
    std::vector<int> field_metadata_offsets;
    int idx = 0;
    for (int i = 0; i < message_generators_.size(); i++) {
      field_metadata_offsets.push_back(idx);
      idx += message_generators_[i]->GenerateFieldMetadata(printer);
    }
    field_metadata_offsets.push_back(idx);
    format.Outdent();
    format(
        "};\n"
        "const ::$proto_ns$::internal::SerializationTable "
        "$tablename$::serialization_table[] = {\n");
    format.Indent();
    // We rely on the order we layout the tables to match the order we
    // calculate them with FlattenMessagesInFile, so we check here that
    // these match exactly.
    std::vector<const Descriptor*> calculated_order =
        FlattenMessagesInFile(file_);
    GOOGLE_CHECK_EQ(calculated_order.size(), message_generators_.size());
    for (int i = 0; i < message_generators_.size(); i++) {
      GOOGLE_CHECK_EQ(calculated_order[i], message_generators_[i]->descriptor_);
      format("{$1$, $tablename$::field_metadata + $2$},\n",
             field_metadata_offsets[i + 1] - field_metadata_offsets[i],  // 1
             field_metadata_offsets[i]);                                 // 2
    }
    format.Outdent();
    format(
        "};\n"
        "\n");
  }
}